

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilut.h
# Opt level: O1

int Mini_LutCreatePo(Mini_Lut_t *p,int Var0)

{
  int local_c;
  
  local_c = Var0;
  if ((-1 < Var0) && (Var0 < p->nSize)) {
    Mini_LutPush(p,1,&local_c,(uint *)0x0);
    p->pArray[((long)p->nSize + -1) * (long)p->LutSize + 1] = 0x7ffffffe;
    return p->nSize + -1;
  }
  __assert_fail("Var0 >= 0 && Var0 < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/miniaig/minilut.h"
                ,0xed,"int Mini_LutCreatePo(Mini_Lut_t *, int)");
}

Assistant:

static int Mini_LutCreatePo( Mini_Lut_t * p, int Var0 )
{
    assert( Var0 >= 0 && Var0 < p->nSize );
    Mini_LutPush( p, 1, &Var0, NULL );
    // mark PO by setting its 2nd fanin to the special number
    p->pArray[p->LutSize*(p->nSize - 1)+1] = MINI_LUT_NULL2;
    return p->nSize - 1;
}